

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

FString __thiscall Stat_psprites::GetStats(Stat_psprites *this)

{
  long lVar1;
  long lVar2;
  int i;
  ulong uVar3;
  undefined8 *puVar4;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->super_FStat)._vptr_FStat = (_func_int **)0x8a502c;
  uVar3 = 0;
  do {
    if (playeringame[uVar3] == true) {
      FString::AppendFormat((FString *)this,"[psprites] player: %d | layers: ",uVar3 & 0xffffffff);
      lVar1 = (&DAT_00a60370)[uVar3 * 0x54];
      if (lVar1 != 0) {
        if ((*(byte *)(lVar1 + 0x20) & 0x20) == 0) {
          do {
            lVar2 = lVar1;
            FString::AppendFormat((FString *)this,"%d, ",(ulong)*(uint *)(lVar2 + 0x80));
            lVar1 = *(long *)(lVar2 + 0x60);
            if (lVar1 == 0) goto LAB_00559172;
          } while ((*(byte *)(lVar1 + 0x20) & 0x20) == 0);
          puVar4 = (undefined8 *)(lVar2 + 0x60);
        }
        else {
          puVar4 = &DAT_00a60370 + uVar3 * 0x54;
        }
        *puVar4 = 0;
      }
LAB_00559172:
      FString::AppendFormat((FString *)this,"\n");
    }
    uVar3 = uVar3 + 1;
    if (uVar3 == 8) {
      return (FString)(char *)this;
    }
  } while( true );
}

Assistant:

ADD_STAT(psprites)
{
	FString out;
	DPSprite *pspr;
	for (int i = 0; i < MAXPLAYERS; i++)
	{
		if (!playeringame[i])
			continue;

		out.AppendFormat("[psprites] player: %d | layers: ", i);

		pspr = players[i].psprites;
		while (pspr)
		{
			out.AppendFormat("%d, ", pspr->GetID());

			pspr = pspr->GetNext();
		}

		out.AppendFormat("\n");
	}

	return out;
}